

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O2

ASTNode * __thiscall
nivalis::anon_unknown_3::Differentiator::copy_ast
          (Differentiator *this,ASTNode *ast,
          vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *out)

{
  ASTNode *pAVar1;
  ASTNode *n;
  ASTNode *local_28;
  
  local_28 = ast;
  skip_ast(&local_28);
  pAVar1 = local_28;
  for (; ast != pAVar1; ast = ast + 1) {
    if (ast->opcode == 3) {
      copy_ast(this,(this->argv).
                    super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].
                    super__Vector_base<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(ast->field_1).ref].
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,out);
    }
    else {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                (out,ast);
    }
  }
  return pAVar1;
}

Assistant:

const Expr::ASTNode* copy_ast(const Expr::ASTNode* ast,
            std::vector<Expr::ASTNode>& out) {
        const auto* init_pos = ast;
        skip_ast(&ast);
        for (const auto* n = init_pos; n != ast; ++n) {
            if (n->opcode == OpCode::arg) {
                // Substitute function argument in terms of the input
                copy_ast(&argv.back()[n->ref][0], out);
            } else {
                out.push_back(*n);
            }
        }
        return ast;
    }